

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_tracker_connection.cpp
# Opt level: O2

bool __thiscall
libtorrent::aux::http_tracker_connection::on_filter_hostname
          (http_tracker_connection *this,http_connection *param_1,string_view hostname)

{
  bool bVar1;
  bool bVar2;
  char *extraout_RDX;
  string_view hostname_00;
  
  bVar1 = session_settings::get_bool(((this->super_tracker_connection).m_man)->m_settings,0x8051);
  bVar2 = true;
  if (!bVar1) {
    hostname_00._M_str = extraout_RDX;
    hostname_00._M_len = (size_t)hostname._M_str;
    bVar2 = is_idna((aux *)hostname._M_len,hostname_00);
    bVar2 = !bVar2;
  }
  return bVar2;
}

Assistant:

bool http_tracker_connection::on_filter_hostname(aux::http_connection&
		, string_view hostname)
	{
		aux::session_settings const& settings = m_man.settings();
		if (settings.get_bool(settings_pack::allow_idna)) return true;
		return !is_idna(hostname);
	}